

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O0

void __thiscall
test_vector_dense_scalar_division_assignment_Test::TestBody
          (test_vector_dense_scalar_division_assignment_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  reference pvVar4;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  double local_100 [2];
  initializer_list<double> local_f0;
  undefined1 local_e0 [8];
  Vector_Dense<double,_2UL> static_vector;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  double local_60 [5];
  initializer_list<double> local_38;
  undefined1 local_28 [8];
  Vector_Dense<double,_0UL> dynamic_vector;
  test_vector_dense_scalar_division_assignment_Test *this_local;
  
  local_60[3] = -5.0;
  local_60[1] = 3.0;
  local_60[2] = 6.0;
  local_38._M_array = local_60 + 1;
  local_38._M_len = 3;
  dynamic_vector.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_28,&local_38);
  local_60[0] = 3.0;
  Disa::Vector_Dense<double,_0UL>::operator/=((Vector_Dense<double,_0UL> *)local_28,local_60);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_80,"dynamic_vector[0]","1.0",*pvVar2,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"dynamic_vector[1]","2.0",*pvVar2,2.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c0,"dynamic_vector[2]","-5.0 / 3.0",*pvVar2,-1.6666666666666667);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(static_vector.super_array<double,_2UL>._M_elems + 1),
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(static_vector.super_array<double,_2UL>._M_elems + 1),&local_c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(static_vector.super_array<double,_2UL>._M_elems + 1));
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_100[0] = 3.0;
  local_100[1] = -5.0;
  local_f0._M_array = local_100;
  local_f0._M_len = 2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense((Vector_Dense<double,_2UL> *)local_e0,&local_f0);
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4010000000000000;
  Disa::Vector_Dense<double,_2UL>::operator/=
            ((Vector_Dense<double,_2UL> *)local_e0,(double *)&gtest_ar_3.message_);
  pvVar4 = std::array<double,_2UL>::operator[]((array<double,_2UL> *)local_e0,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_118,"static_vector[0]","3.0 / 4.0",*pvVar4,0.75);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x5a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  pvVar4 = std::array<double,_2UL>::operator[]((array<double,_2UL> *)local_e0,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_138,"static_vector[1]","-5.0 / 4.0",*pvVar4,-1.25);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_28);
  return;
}

Assistant:

TEST(test_vector_dense, scalar_division_assignment) {
  Vector_Dense<Scalar, 0> dynamic_vector = {3.0, 6.0, -5.0};
  dynamic_vector /= 3.0;
  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], -5.0 / 3.0);

  Vector_Dense<Scalar, 2> static_vector = {3.0, -5.0};
  static_vector /= 4.0;
  EXPECT_DOUBLE_EQ(static_vector[0], 3.0 / 4.0);
  EXPECT_DOUBLE_EQ(static_vector[1], -5.0 / 4.0);
}